

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_copy_s_b_mips(CPUMIPSState *env,uint32_t rd,uint32_t ws,uint32_t n)

{
  uint32_t n_local;
  uint32_t ws_local;
  uint32_t rd_local;
  CPUMIPSState *env_local;
  
  (env->active_tc).gpr[rd] =
       (int)*(char *)((long)(env->active_fpu).fpr + (ulong)(n & 0xf) + (ulong)ws * 0x10);
  return;
}

Assistant:

void helper_msa_copy_s_b(CPUMIPSState *env, uint32_t rd,
                         uint32_t ws, uint32_t n)
{
    n %= 16;
#if defined(HOST_WORDS_BIGENDIAN)
    if (n < 8) {
        n = 8 - n - 1;
    } else {
        n = 24 - n - 1;
    }
#endif
    env->active_tc.gpr[rd] = (int8_t)env->active_fpu.fpr[ws].wr.b[n];
}